

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::paintEvent(QToolButton *this,QPaintEvent *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  QStylePainter local_d8;
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(&local_d8,(QWidget *)this);
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&opt);
  QStylePainter::drawComplexControl(&local_d8,CC_ToolButton,&opt.super_QStyleOptionComplex);
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  QPainter::~QPainter(&local_d8.super_QPainter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}